

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_7::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  TwoLevelIterator *this_local;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_001e5760;
  std::__cxx11::string::~string((string *)&this->data_block_handle_);
  IteratorWrapper::~IteratorWrapper(&this->data_iter_);
  IteratorWrapper::~IteratorWrapper(&this->index_iter_);
  Status::~Status(&this->status_);
  Iterator::~Iterator(&this->super_Iterator);
  return;
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;